

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snr.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  char *__s;
  undefined1 auVar3 [16];
  ulong uVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  ostream *poVar10;
  byte bVar11;
  long lVar12;
  string *input_stream;
  char *__s_00;
  double dVar13;
  double dVar14;
  int frame_length;
  vector<double,_std::allocator<double>_> signal_plus_noise;
  vector<double,_std::allocator<double>_> signal;
  int tmp;
  ifstream ifs2;
  ifstream ifs1;
  int local_630;
  int local_62c;
  string local_628;
  undefined1 local_608 [24];
  ulong local_5f0;
  vector<double,_std::allocator<double>_> local_5e8;
  vector<double,_std::allocator<double>_> local_5d0;
  string local_5b8 [3];
  ios_base local_548 [264];
  string local_440;
  byte abStack_420 [80];
  ios_base local_3d0 [408];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_62c = 0x100;
  local_5f0 = 0;
  local_630 = 0;
  do {
    iVar8 = ya_getopt_long(argc,argv,"l:o:h",(option *)0x0,(int *)0x0);
    if (iVar8 < 0x6c) {
      if (iVar8 == -1) {
        iVar8 = 2;
      }
      else {
        if (iVar8 != 0x68) {
LAB_001037ab:
          anon_unknown.dwarf_3010::PrintUsage((ostream *)&std::cerr);
          goto LAB_001039a5;
        }
        anon_unknown.dwarf_3010::PrintUsage((ostream *)&std::cout);
        local_630 = 0;
        iVar8 = 1;
      }
    }
    else {
      if (iVar8 == 0x6f) {
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)&local_440);
        bVar6 = sptk::ConvertStringToInteger(&local_238,(int *)local_5b8);
        if (bVar6) {
          bVar6 = sptk::IsInRange((int)local_5b8[0]._M_dataplus._M_p,0,2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p);
          }
          if (bVar6) {
            iVar8 = 0;
            local_5f0 = (ulong)local_5b8[0]._M_dataplus._M_p & 0xffffffff;
            goto LAB_001039b2;
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -o option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"in the range of ",0x10);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," to ",4);
        std::ostream::operator<<((ostream *)poVar10,2);
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"snr","");
        sptk::PrintErrorMessage(&local_440,(ostringstream *)&local_238);
      }
      else {
        if (iVar8 != 0x6c) goto LAB_001037ab;
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)&local_440);
        bVar6 = sptk::ConvertStringToInteger(&local_238,&local_62c);
        bVar11 = 0 < local_62c;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          local_608[0] = 0 < local_62c;
          operator_delete(local_238._M_dataplus._M_p);
          bVar11 = local_608[0];
        }
        iVar8 = 0;
        if ((bVar6 & bVar11) != 0) goto LAB_001039b2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"snr","");
        sptk::PrintErrorMessage(&local_440,(ostringstream *)&local_238);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
LAB_001039a5:
      iVar8 = 1;
      local_630 = 1;
    }
LAB_001039b2:
  } while (iVar8 == 0);
  if (iVar8 != 2) {
    return local_630;
  }
  if (argc - ya_optind == 1) {
    lVar12 = (long)argc + -1;
    __s_00 = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"Just two input files, file1 and infile, are required",0x34);
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"snr","");
      sptk::PrintErrorMessage(&local_440,(ostringstream *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      return 1;
    }
    lVar12 = (long)argc + -2;
    __s_00 = argv[(long)argc + -1];
  }
  __s = argv[lVar12];
  std::ifstream::ifstream(&local_238);
  std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s);
  uVar4 = local_5f0;
  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_440,"Cannot open file ",0x11);
    if (__s == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffff9c8 +
                      (int)*(undefined8 *)(local_440._M_dataplus._M_p + -0x18) + 0x1f8);
    }
    else {
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,__s,sVar9);
    }
    local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"snr","");
    sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
      operator_delete(local_5b8[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_440);
    std::ios_base::~ios_base(local_3d0);
    local_630 = 1;
    goto LAB_00104251;
  }
  input_stream = &local_440;
  std::ifstream::ifstream(input_stream);
  if ((__s_00 == (char *)0x0) ||
     (std::ifstream::open((char *)&local_440,(_Ios_Openmode)__s_00),
     (abStack_420[*(long *)(local_440._M_dataplus._M_p + -0x18)] & 5) == 0)) {
    cVar5 = std::__basic_file<char>::is_open();
    if (cVar5 == '\0') {
      input_stream = (string *)&std::cin;
    }
    if ((uint)uVar4 == 0) {
      local_608._0_16_ = ZEXT816(0);
      while ((bVar6 = sptk::ReadStream<double>((double *)&local_5d0,(istream *)&local_238), bVar6 &&
             (bVar6 = sptk::ReadStream<double>((double *)&local_5e8,(istream *)input_stream), bVar6)
             )) {
        dVar13 = (double)local_608._8_8_ +
                 ((double)local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start -
                 (double)local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) *
                 ((double)local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start -
                 (double)local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
        local_608._8_4_ = SUB84(dVar13,0);
        local_608._0_8_ =
             (double)local_608._0_8_ +
             (double)local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start *
             (double)local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        local_608._12_4_ = (int)((ulong)dVar13 >> 0x20);
      }
      if (((double)local_608._0_8_ != 0.0) || (NAN((double)local_608._0_8_))) {
        if (((double)local_608._8_8_ != 0.0) || (NAN((double)local_608._8_8_))) {
          dVar13 = log10((double)local_608._0_8_ / (double)local_608._8_8_);
          bVar6 = sptk::WriteStream<double>(dVar13 * 10.0,(ostream *)&std::cout);
          if (!bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,"Failed to write SNR",0x13);
            local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
            sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_628._M_dataplus._M_p != &local_628.field_2) {
              operator_delete(local_628._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
            std::ios_base::~ios_base(local_548);
            local_630 = 1;
          }
          goto LAB_00104233;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_5b8,"The noise power is 0.0",0x16);
        local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
        sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_5b8,"The signal power is 0.0",0x17);
        local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
        sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
      std::ios_base::~ios_base(local_548);
      local_630 = 1;
      bVar6 = false;
LAB_00104233:
      if (bVar6 == false) goto LAB_00104240;
    }
    else if ((uint)uVar4 < 3) {
      std::vector<double,_std::allocator<double>_>::vector
                (&local_5d0,(long)local_62c,(allocator_type *)local_5b8);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_5e8,(long)local_62c,(allocator_type *)local_5b8);
      paVar1 = &local_628.field_2;
      iVar8 = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_608._8_8_;
      local_608._0_16_ = auVar3 << 0x40;
      while ((bVar6 = sptk::ReadStream<double>
                                (false,0,0,local_62c,&local_5d0,(istream *)&local_238,(int *)0x0),
             bVar6 && (bVar6 = sptk::ReadStream<double>
                                         (false,0,0,local_62c,&local_5e8,(istream *)input_stream,
                                          (int *)0x0), bVar6))) {
        if ((long)local_62c < 1) {
          dVar13 = 0.0;
          dVar14 = 0.0;
        }
        else {
          dVar13 = 0.0;
          dVar14 = 0.0;
          lVar12 = 0;
          do {
            dVar2 = local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12];
            dVar13 = dVar13 + dVar2 * dVar2;
            dVar14 = dVar14 + (local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar12] - dVar2) *
                              (local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar12] - dVar2);
            lVar12 = lVar12 + 1;
          } while (local_62c != lVar12);
        }
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          if ((dVar14 == 0.0) && (!NAN(dVar14))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,"The noise power of ",0x13);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_5b8,iVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"th frame is 0.0",0xf);
            local_628._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
            sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
            goto LAB_00103eb4;
          }
          dVar13 = log10(dVar13 / dVar14);
          if ((int)local_5f0 == 1) {
            local_608._0_8_ = (double)local_608._0_8_ + dVar13 * 10.0;
            bVar6 = true;
          }
          else {
            bVar6 = true;
            if (((int)local_5f0 == 2) &&
               (bVar7 = sptk::WriteStream<double>(dVar13 * 10.0,(ostream *)&std::cout), !bVar7)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5b8,"Failed to write segmental SNR of ",0x21);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_5b8,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"th frame",8);
              local_628._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
              sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
              goto LAB_00103eb4;
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_5b8,"The signal power of ",0x14);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_5b8,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"th frame is 0.0",0xf);
          local_628._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
          sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
LAB_00103eb4:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628._M_dataplus._M_p != paVar1) {
            operator_delete(local_628._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
          std::ios_base::~ios_base(local_548);
          local_630 = 1;
          bVar6 = false;
        }
        if (!bVar6) {
          bVar6 = false;
          goto LAB_00104210;
        }
        iVar8 = iVar8 + 1;
      }
      bVar6 = true;
      if (iVar8 != 0 && (int)local_5f0 == 1) {
        bVar7 = sptk::WriteStream<double>
                          ((double)local_608._0_8_ / (double)iVar8,(ostream *)&std::cout);
        bVar6 = true;
        if (!bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_5b8,"Failed to write segmental SNR",0x1d);
          local_628._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
          sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628._M_dataplus._M_p != paVar1) {
            operator_delete(local_628._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
          std::ios_base::~ios_base(local_548);
          local_630 = 1;
          bVar6 = false;
        }
      }
LAB_00104210:
      if (local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      goto LAB_00104233;
    }
    local_630 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,"Cannot open file ",0x11);
    sVar9 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,__s_00,sVar9);
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"snr","");
    sptk::PrintErrorMessage(&local_628,(ostringstream *)local_5b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
    std::ios_base::~ios_base(local_548);
    local_630 = 1;
  }
LAB_00104240:
  std::ifstream::~ifstream(&local_440);
LAB_00104251:
  std::ifstream::~ifstream(&local_238);
  return local_630;
}

Assistant:

int main(int argc, char* argv[]) {
  int frame_length(kDefaultFrameLength);
  OutputType output_type(kDefaultOutputType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_length) ||
            frame_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(OutputType::kNumOutputTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
        output_type = static_cast<OutputType>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  // Get input file names.
  const char* signal_file;
  const char* signal_plus_noise_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    signal_file = argv[argc - 2];
    signal_plus_noise_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    signal_file = argv[argc - 1];
    signal_plus_noise_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1 and infile, are required";
    sptk::PrintErrorMessage("snr", error_message);
    return 1;
  }

  // Open stream for reading signal sequence.
  std::ifstream ifs1;
  ifs1.open(signal_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << signal_file;
    sptk::PrintErrorMessage("snr", error_message);
    return 1;
  }
  std::istream& stream_for_signal(ifs1);

  // Open stream for reading signal plus noise sequence.
  std::ifstream ifs2;
  if (NULL != signal_plus_noise_file) {
    ifs2.open(signal_plus_noise_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << signal_plus_noise_file;
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
  }
  std::istream& stream_for_signal_plus_noise(ifs2.is_open() ? ifs2 : std::cin);

  if (OutputType::kSnr == output_type) {
    double signal;
    double signal_plus_noise;
    double signal_power(0.0);
    double noise_power(0.0);
    while (
        sptk::ReadStream(&signal, &stream_for_signal) &&
        sptk::ReadStream(&signal_plus_noise, &stream_for_signal_plus_noise)) {
      signal_power += signal * signal;

      const double noise(signal_plus_noise - signal);
      noise_power += noise * noise;
    }

    if (0.0 == signal_power) {
      std::ostringstream error_message;
      error_message << "The signal power is 0.0";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
    if (0.0 == noise_power) {
      std::ostringstream error_message;
      error_message << "The noise power is 0.0";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }

    const double snr(10.0 * std::log10(signal_power / noise_power));
    if (!sptk::WriteStream(snr, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write SNR";
      sptk::PrintErrorMessage("snr", error_message);
      return 1;
    }
  } else if (OutputType::kSegmentalSnr == output_type ||
             OutputType::kSegmentalSnrPerFrame == output_type) {
    std::vector<double> signal(frame_length);
    std::vector<double> signal_plus_noise(frame_length);
    double segmental_snr(0.0);
    int frame_index(0);
    for (; sptk::ReadStream(false, 0, 0, frame_length, &signal,
                            &stream_for_signal, NULL) &&
           sptk::ReadStream(false, 0, 0, frame_length, &signal_plus_noise,
                            &stream_for_signal_plus_noise, NULL);
         ++frame_index) {
      double segmental_signal_power(0.0);
      double segmental_noise_power(0.0);

      for (int i(0); i < frame_length; ++i) {
        segmental_signal_power += signal[i] * signal[i];

        const double noise(signal_plus_noise[i] - signal[i]);
        segmental_noise_power += noise * noise;
      }
      if (0.0 == segmental_signal_power) {
        std::ostringstream error_message;
        error_message << "The signal power of " << frame_index
                      << "th frame is 0.0";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }
      if (0.0 == segmental_noise_power) {
        std::ostringstream error_message;
        error_message << "The noise power of " << frame_index
                      << "th frame is 0.0";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }

      const double segmental_snr_of_current_frame(
          10.0 * std::log10(segmental_signal_power / segmental_noise_power));
      if (OutputType::kSegmentalSnr == output_type) {
        segmental_snr += segmental_snr_of_current_frame;
      } else if (OutputType::kSegmentalSnrPerFrame == output_type) {
        if (!sptk::WriteStream(segmental_snr_of_current_frame, &std::cout)) {
          std::ostringstream error_message;
          error_message << "Failed to write segmental SNR of " << frame_index
                        << "th frame";
          sptk::PrintErrorMessage("snr", error_message);
          return 1;
        }
      }
    }

    if (OutputType::kSegmentalSnr == output_type && 0 < frame_index) {
      segmental_snr /= frame_index;
      if (!sptk::WriteStream(segmental_snr, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write segmental SNR";
        sptk::PrintErrorMessage("snr", error_message);
        return 1;
      }
    }
  }

  return 0;
}